

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O3

void upscale_flow_component(double *flow,int cur_width,int cur_height,int stride,double *tmpbuf)

{
  uint uVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  double *row;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  double *pdVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  
  if (0 < cur_height) {
    iVar8 = -2;
    iVar3 = -1;
    uVar9 = 0;
    do {
      if (0 < cur_width) {
        uVar16 = 0;
        iVar4 = iVar8;
        iVar12 = iVar3;
        do {
          dVar17 = 0.0;
          lVar6 = 0;
          iVar15 = iVar4;
          do {
            dVar17 = dVar17 + flow[iVar15] * *(double *)((long)flow_upscale_filter[0] + lVar6);
            lVar6 = lVar6 + 8;
            iVar15 = iVar15 + 1;
          } while (lVar6 != 0x20);
          tmpbuf[uVar9 * (long)stride + uVar16 * 2] = dVar17 + dVar17;
          dVar17 = 0.0;
          lVar6 = 0;
          do {
            dVar17 = dVar17 + flow[iVar12 + (int)lVar6] * flow_upscale_filter[1][lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          tmpbuf[(int)uVar16 * 2 + (int)(uVar9 * (long)stride) + 1] = dVar17 + dVar17;
          uVar16 = uVar16 + 1;
          iVar4 = iVar4 + 1;
          iVar12 = iVar12 + 1;
        } while (uVar16 != (uint)cur_width);
      }
      uVar9 = uVar9 + 1;
      iVar8 = iVar8 + stride;
      iVar3 = iVar3 + stride;
    } while (uVar9 != (uint)cur_height);
  }
  lVar6 = (long)stride;
  uVar1 = cur_width * 2;
  pdVar2 = tmpbuf + lVar6 * -2;
  lVar7 = 2;
  do {
    memcpy(pdVar2,tmpbuf,(long)(int)uVar1 << 3);
    pdVar2 = pdVar2 + lVar6;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  pdVar2 = tmpbuf + cur_height * lVar6;
  lVar7 = 2;
  do {
    memcpy(pdVar2,tmpbuf + (cur_height + -1) * stride,(long)(int)uVar1 << 3);
    pdVar2 = pdVar2 + lVar6;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  if (0 < cur_height) {
    uVar9 = 1;
    if (1 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    pdVar2 = tmpbuf + lVar6 * -2;
    pdVar14 = tmpbuf + -lVar6;
    uVar16 = 0;
    do {
      if (0 < cur_width) {
        uVar13 = 0;
        pdVar10 = pdVar14;
        pdVar11 = pdVar2;
        do {
          dVar17 = 0.0;
          lVar7 = 0;
          pdVar5 = pdVar11;
          do {
            dVar17 = dVar17 + *pdVar5 * *(double *)((long)flow_upscale_filter[0] + lVar7);
            lVar7 = lVar7 + 8;
            pdVar5 = pdVar5 + lVar6;
          } while (lVar7 != 0x20);
          flow[uVar16 * 2 * lVar6 + uVar13] = dVar17;
          dVar17 = 0.0;
          lVar7 = 0;
          pdVar5 = pdVar10;
          do {
            dVar17 = dVar17 + *pdVar5 * flow_upscale_filter[1][lVar7];
            pdVar5 = pdVar5 + lVar6;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          flow[(uVar16 * 2 + 1) * lVar6 + uVar13] = dVar17;
          uVar13 = uVar13 + 1;
          pdVar11 = pdVar11 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar13 != uVar9);
      }
      uVar16 = uVar16 + 1;
      pdVar2 = pdVar2 + lVar6;
      pdVar14 = pdVar14 + lVar6;
    } while (uVar16 != (uint)cur_height);
  }
  return;
}

Assistant:

static void upscale_flow_component(double *flow, int cur_width, int cur_height,
                                   int stride, double *tmpbuf) {
  const int half_len = FLOW_UPSCALE_TAPS / 2;

  // Check that the outer border is large enough to avoid needing to clamp
  // the source locations
  assert(half_len <= FLOW_BORDER_OUTER);

  // Horizontal upscale and multiply by 2
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < cur_width; j++) {
      double left = 0;
      for (int k = -half_len; k < half_len; k++) {
        left +=
            flow[i * stride + (j + k)] * flow_upscale_filter[0][k + half_len];
      }
      tmpbuf[i * stride + (2 * j + 0)] = 2.0 * left;

      // Right output pixel is 0.25 units to the right of the input pixel
      double right = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        right += flow[i * stride + (j + k)] *
                 flow_upscale_filter[1][k + (half_len - 1)];
      }
      tmpbuf[i * stride + (2 * j + 1)] = 2.0 * right;
    }
  }

  // Fill in top and bottom borders of tmpbuf
  const double *top_row = &tmpbuf[0];
  for (int i = -FLOW_BORDER_OUTER; i < 0; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, top_row, 2 * cur_width * sizeof(*row));
  }

  const double *bottom_row = &tmpbuf[(cur_height - 1) * stride];
  for (int i = cur_height; i < cur_height + FLOW_BORDER_OUTER; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, bottom_row, 2 * cur_width * sizeof(*row));
  }

  // Vertical upscale
  int upscaled_width = cur_width * 2;
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < upscaled_width; j++) {
      double top = 0;
      for (int k = -half_len; k < half_len; k++) {
        top +=
            tmpbuf[(i + k) * stride + j] * flow_upscale_filter[0][k + half_len];
      }
      flow[(2 * i) * stride + j] = top;

      double bottom = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        bottom += tmpbuf[(i + k) * stride + j] *
                  flow_upscale_filter[1][k + (half_len - 1)];
      }
      flow[(2 * i + 1) * stride + j] = bottom;
    }
  }
}